

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder.cc
# Opt level: O2

bool __thiscall
bssl::CertPathIter::GetNextPath
          (CertPathIter *this,ParsedCertificateList *out_certs,CertificateTrust *out_last_cert_trust
          ,CertPathErrors *out_errors,CertPathBuilderDelegate *delegate,uint32_t *iteration_count,
          uint32_t max_iteration_count,uint32_t max_path_building_depth)

{
  CertIssuerIterPath *this_00;
  CertificateTrust *pCVar1;
  set<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *this_01;
  size_t *psVar2;
  pointer *ppuVar3;
  undefined8 *puVar4;
  uint uVar5;
  pointer puVar6;
  __uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
  _Var7;
  pointer ppCVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  TrustStore *pTVar11;
  _Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
  *__last;
  _Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
  *this_02;
  pointer puVar12;
  IssuerEntry *pIVar13;
  CertificateTrustType CVar14;
  int iVar15;
  CertificateTrustType CVar16;
  ulong uVar17;
  IssuerEntry *pIVar18;
  pointer psVar19;
  _func_int **pp_Var20;
  undefined4 extraout_var;
  const_iterator cVar21;
  CertIssuersIter *pCVar22;
  pointer __result;
  pointer puVar23;
  CertErrors *pCVar24;
  IssuerEntry *this_03;
  long lVar25;
  _Tp_alloc_type *__alloc;
  undefined **ppuVar26;
  IssuerEntry *pIVar27;
  char *pcVar28;
  ParsedCertificate *cert;
  size_t __n;
  ParsedCertificate *extraout_RDX;
  ParsedCertificate *extraout_RDX_00;
  ParsedCertificate *pPVar29;
  ParsedCertificate *extraout_RDX_01;
  ParsedCertificateList *certs;
  ParsedCertificateList *certs_00;
  ParsedCertificateList *certs_01;
  pointer ppCVar30;
  size_t sVar31;
  pointer puVar32;
  pointer *__ptr;
  ulong uVar33;
  IssuerEntry *pIVar34;
  pointer pIVar35;
  ulong uVar36;
  pointer pIVar37;
  bool bVar38;
  pair<std::_Rb_tree_iterator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_bool>
  pVar39;
  undefined8 uStack_130;
  ParsedCertificateList new_issuers;
  _Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false> local_c0;
  string local_b8;
  CertPathBuilderDelegate *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  CertificateTrust *local_50;
  CertIssuerSources *local_48;
  uint *local_40;
  _Base_ptr local_38;
  
  local_40 = iteration_count;
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::clear(out_certs);
  out_last_cert_trust->type = UNSPECIFIED;
  out_last_cert_trust->enforce_anchor_expiry = false;
  out_last_cert_trust->enforce_anchor_constraints = false;
  out_last_cert_trust->require_anchor_basic_constraints = false;
  out_last_cert_trust->require_leaf_selfsigned = false;
  this_00 = &this->cur_path_;
  pCVar1 = &(this->next_issuer_).trust;
  this_01 = &(this->cur_path_).present_certs_;
  local_38 = &(this->cur_path_).present_certs_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_48 = &this->cert_issuer_sources_;
  local_98 = delegate;
  local_50 = out_last_cert_trust;
LAB_003812d8:
  iVar15 = (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
             [7])(delegate);
  if ((char)iVar15 != '\0') {
    if ((this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if ((this->next_issuer_).cert.
          super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::
        vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ::push_back(out_certs,(value_type *)this);
      }
    }
    else {
      anon_unknown_6::CertIssuerIterPath::CopyPath(this_00,out_certs);
    }
    pCVar24 = CertPathErrors::GetOtherErrors(out_errors);
    ppuVar26 = &cert_errors::kDeadlineExceeded;
LAB_00381e99:
    CertErrors::AddError(pCVar24,*ppuVar26);
    return false;
  }
  if ((max_path_building_depth != 0) &&
     ((ulong)max_path_building_depth <=
      (ulong)((long)(this->cur_path_).cur_path_.
                    super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->cur_path_).cur_path_.
                    super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3))) {
    anon_unknown_6::CertIssuerIterPath::CopyPath(this_00,out_certs);
    pCVar24 = CertPathErrors::GetOtherErrors(out_errors);
    CertErrors::AddError(pCVar24,"Depth limit exceeded");
    iVar15 = (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
               [8])(delegate);
    if ((char)iVar15 == '\0') goto LAB_00381e1d;
    (anonymous_namespace)::PathDebugString_abi_cxx11_
              (&local_b8,(_anonymous_namespace_ *)out_certs,certs_00);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &new_issuers,
                     "CertPathIter reached depth limit. Returning partial path and backtracking:\n",
                     &local_b8);
    (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[9])
              (delegate,new_issuers.
                        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
               new_issuers.
               super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
LAB_00381e0b:
    ::std::__cxx11::string::~string((string *)&new_issuers);
    ::std::__cxx11::string::~string((string *)&local_b8);
LAB_00381e1d:
    anon_unknown_6::CertIssuerIterPath::Pop(this_00);
    return true;
  }
  if ((this->next_issuer_).cert.
      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    puVar32 = (this->cur_path_).cur_path_.
              super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == puVar32) {
      iVar15 = (*(delegate->super_VerifyCertificateChainDelegate).
                 _vptr_VerifyCertificateChainDelegate[8])(delegate);
      if ((char)iVar15 == '\0') {
        return false;
      }
      (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[9])
                (delegate,0x23,"CertPathIter exhausted all paths...");
      return false;
    }
    uVar5 = *local_40;
    *local_40 = uVar5 + 1;
    if (max_iteration_count < uVar5 + 1 && max_iteration_count != 0) {
      anon_unknown_6::CertIssuerIterPath::CopyPath(this_00,out_certs);
      pCVar24 = CertPathErrors::GetOtherErrors(out_errors);
      ppuVar26 = &cert_errors::kIterationLimitExceeded;
      goto LAB_00381e99;
    }
    pCVar22 = puVar32[-1]._M_t.
              super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
              ._M_t.
              super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
              .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
              _M_head_impl;
    if (pCVar22->did_initial_query_ == false) {
      pCVar22->did_initial_query_ = true;
      ppCVar8 = (pCVar22->cert_issuer_sources_->
                super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar30 = (pCVar22->cert_issuer_sources_->
                      super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppCVar30 != ppCVar8;
          ppCVar30 = ppCVar30 + 1) {
        new_issuers.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        new_issuers.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        new_issuers.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (*(*ppCVar30)->_vptr_CertIssuerSource[2])
                  (*ppCVar30,
                   (pCVar22->cert_).
                   super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&new_issuers);
        local_b8._M_dataplus._M_p =
             (pointer)new_issuers.
                      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_b8._M_string_length =
             (size_type)
             new_issuers.
             super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_b8.field_2._M_allocated_capacity =
             (size_type)
             new_issuers.
             super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        new_issuers.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        new_issuers.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        new_issuers.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anon_unknown_6::CertIssuersIter::AddIssuers(pCVar22,(ParsedCertificateList *)&local_b8);
        ::std::
        vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   *)&local_b8);
        ::std::
        vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ::~vector(&new_issuers);
      }
    }
    sVar31 = pCVar22->cur_issuer_;
    pIVar35 = (pCVar22->issuers_).
              super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar37 = (pCVar22->issuers_).
              super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar17 = (long)pIVar37 - (long)pIVar35 >> 5;
    if (uVar17 <= sVar31) {
      if (pCVar22->did_async_issuer_query_ == false) {
        pCVar22->did_async_issuer_query_ = true;
        pCVar22->cur_async_request_ = 0;
        ppCVar8 = (pCVar22->cert_issuer_sources_->
                  super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        for (ppCVar30 = (pCVar22->cert_issuer_sources_->
                        super__Vector_base<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppCVar30 != ppCVar8;
            ppCVar30 = ppCVar30 + 1) {
          new_issuers.
          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (*(*ppCVar30)->_vptr_CertIssuerSource[3])
                    (*ppCVar30,
                     (pCVar22->cert_).
                     super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&new_issuers);
          if ((new_issuers.
               super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
             (::std::
              vector<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>,std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>>>
              ::
              emplace_back<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>>
                        ((vector<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>,std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,std::default_delete<bssl::CertIssuerSource::Request>>>>
                          *)&pCVar22->pending_async_requests_,
                         (unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
                          *)&new_issuers),
             new_issuers.
             super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
             ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
            (*(code *)((((new_issuers.
                          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr)->cert_).data_.data_)();
          }
        }
      }
      while( true ) {
        sVar31 = pCVar22->cur_issuer_;
        pIVar35 = (pCVar22->issuers_).
                  super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar37 = (pCVar22->issuers_).
                  super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        uVar17 = (long)pIVar37 - (long)pIVar35 >> 5;
        if (sVar31 < uVar17) break;
        puVar6 = (pCVar22->pending_async_requests_).
                 super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pCVar22->pending_async_requests_).
                          super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3) <=
            pCVar22->cur_async_request_) break;
        new_issuers.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        new_issuers.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        new_issuers.
        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        _Var7._M_t.
        super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
        .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
             puVar6[pCVar22->cur_async_request_]._M_t.
             super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
             ._M_t;
        (**(code **)(*(long *)_Var7._M_t.
                              super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                              .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                              _M_head_impl + 0x10))
                  (_Var7._M_t.
                   super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                   .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl,
                   &new_issuers);
        if (new_issuers.
            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            new_issuers.
            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          sVar31 = pCVar22->cur_async_request_;
          puVar6 = (pCVar22->pending_async_requests_).
                   super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pCVar22->cur_async_request_ = sVar31 + 1;
          _Var7._M_t.
          super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
          .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl =
               puVar6[sVar31]._M_t.
               super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
               ._M_t;
          puVar6[sVar31]._M_t.
          super___uniq_ptr_impl<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>
          ._M_t = (tuple<bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                   )0x0;
          if ((_Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
               )_Var7._M_t.
                super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>._M_head_impl !=
              (Request *)0x0) {
            (**(code **)(*(long *)_Var7._M_t.
                                  super__Tuple_impl<0UL,_bssl::CertIssuerSource::Request_*,_std::default_delete<bssl::CertIssuerSource::Request>_>
                                  .super__Head_base<0UL,_bssl::CertIssuerSource::Request_*,_false>.
                                  _M_head_impl + 8))();
          }
        }
        else {
          local_70._M_dataplus._M_p =
               (pointer)new_issuers.
                        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_70._M_string_length =
               (size_type)
               new_issuers.
               super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_70.field_2._M_allocated_capacity =
               (size_type)
               new_issuers.
               super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          new_issuers.
          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          new_issuers.
          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          new_issuers.
          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          anon_unknown_6::CertIssuersIter::AddIssuers(pCVar22,(ParsedCertificateList *)&local_70);
          ::std::
          vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ::~vector((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     *)&local_70);
        }
        ::std::
        vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
        ::~vector(&new_issuers);
      }
    }
    if (sVar31 < uVar17) {
      if (pCVar22->issuers_needs_sort_ == true) {
        this_03 = pIVar35 + sVar31;
        if (this_03 != pIVar37) {
          new_issuers.
          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((((long)pIVar37 - (long)this_03 >> 5) + 1) / 2);
          new_issuers.
          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          new_issuers.
          super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          psVar19 = new_issuers.
                    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_003813d6:
          if ((long)psVar19 < 1) {
            ::std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry*,std::vector<bssl::(anonymous_namespace)::IssuerEntry,std::allocator<bssl::(anonymous_namespace)::IssuerEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<bssl::(anonymous_namespace)::CertIssuersIter::SortRemainingIssuers()::__0>>
                      (this_03,pIVar37);
          }
          else {
            pIVar18 = (IssuerEntry *)operator_new((long)psVar19 * 0x20,(nothrow_t *)&::std::nothrow)
            ;
            if (pIVar18 == (IssuerEntry *)0x0) goto code_r0x003813fe;
            peVar9 = (this_03->cert).
                     super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            (pIVar18->cert).
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar9;
            p_Var10 = (this_03->cert).
                      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            (this_03->cert).
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (pIVar18->cert).
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = p_Var10;
            (this_03->cert).
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            lVar25 = 0;
            pIVar13 = pIVar18;
            pIVar34 = this_03;
            while( true ) {
              pIVar27 = pIVar13;
              *(int *)((long)&pIVar18->trust_and_key_id_match_ordering + lVar25) =
                   pIVar34->trust_and_key_id_match_ordering;
              *(CertificateTrust *)((long)&(pIVar18->trust).type + lVar25) = pIVar34->trust;
              if ((long)psVar19 * 0x20 - 0x20U == lVar25) break;
              *(element_type **)
               ((long)&pIVar18[1].cert.
                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar25) = peVar9;
              *(undefined8 *)
               ((long)&pIVar18[1].cert.
                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + lVar25) =
                   *(undefined8 *)
                    ((long)&(pIVar18->cert).
                            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + lVar25);
              puVar4 = (undefined8 *)
                       ((long)&(pIVar18->cert).
                               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar25);
              *puVar4 = 0;
              puVar4[1] = 0;
              lVar25 = lVar25 + 0x20;
              pIVar13 = pIVar27 + 1;
              pIVar34 = pIVar27;
            }
            anon_unknown_6::IssuerEntry::operator=
                      (this_03,(IssuerEntry *)
                               ((long)&(pIVar18->cert).
                                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + lVar25));
            new_issuers.
            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = psVar19;
            new_issuers.
            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pIVar18;
            ::std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry*,std::vector<bssl::(anonymous_namespace)::IssuerEntry,std::allocator<bssl::(anonymous_namespace)::IssuerEntry>>>,bssl::(anonymous_namespace)::IssuerEntry*,long,__gnu_cxx::__ops::_Iter_comp_iter<bssl::(anonymous_namespace)::CertIssuersIter::SortRemainingIssuers()::__0>>
                      (this_03,pIVar37,pIVar18,psVar19);
          }
          ::std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry_*,_std::vector<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>_>,_bssl::(anonymous_namespace)::IssuerEntry>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<bssl::(anonymous_namespace)::IssuerEntry_*,_std::vector<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>_>,_bssl::(anonymous_namespace)::IssuerEntry>
                      *)&new_issuers);
          pIVar35 = (pCVar22->issuers_).
                    super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          sVar31 = pCVar22->cur_issuer_;
          delegate = local_98;
        }
        pCVar22->issuers_needs_sort_ = false;
      }
      pCVar22->cur_issuer_ = sVar31 + 1;
      ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)
                 (pIVar35 + sVar31));
      *pCVar1 = pIVar35[sVar31].trust;
      (this->next_issuer_).trust_and_key_id_match_ordering =
           pIVar35[sVar31].trust_and_key_id_match_ordering;
    }
    else {
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      anon_unknown_6::IssuerEntry::operator=(&this->next_issuer_,(IssuerEntry *)&new_issuers);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &new_issuers.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((this->next_issuer_).cert.
        super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pCVar22 = (this->cur_path_).cur_path_.
                super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                ._M_t.
                super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
                _M_head_impl;
      if ((ulong)((long)(pCVar22->issuers_).
                        super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  *(long *)&(pCVar22->issuers_).
                            super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
                            ._M_impl >> 5) <= pCVar22->skipped_issuer_count_) {
        anon_unknown_6::CertIssuerIterPath::CopyPath(this_00,out_certs);
        pCVar24 = CertPathErrors::GetErrorsForCert
                            (out_errors,
                             ((long)(out_certs->
                                    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(out_certs->
                                    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
        CertErrors::AddError(pCVar24,"No matching issuer found");
        iVar15 = (*(delegate->super_VerifyCertificateChainDelegate).
                   _vptr_VerifyCertificateChainDelegate[8])(delegate);
        if ((char)iVar15 == '\0') goto LAB_00381e1d;
        (anonymous_namespace)::PathDebugString_abi_cxx11_
                  (&local_b8,(_anonymous_namespace_ *)out_certs,certs_01);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &new_issuers,"CertPathIter returning partial path and backtracking:\n",
                         &local_b8);
        (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[9])
                  (delegate,new_issuers.
                            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                   new_issuers.
                   super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        goto LAB_00381e0b;
      }
      iVar15 = (*(delegate->super_VerifyCertificateChainDelegate).
                 _vptr_VerifyCertificateChainDelegate[8])(delegate);
      if ((char)iVar15 != '\0') {
        (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[9])
                  (delegate,0x1c,"CertPathIter backtracking...");
      }
      anon_unknown_6::CertIssuerIterPath::Pop(this_00);
      goto LAB_003812d8;
    }
  }
  CVar16 = pCVar1->type;
  if (CVar16 == TRUSTED_LEAF) {
    CVar14 = TRUSTED_LEAF;
    if ((this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar15 = (*(delegate->super_VerifyCertificateChainDelegate).
                 _vptr_VerifyCertificateChainDelegate[8])(delegate);
      if ((char)iVar15 != '\0') {
        pp_Var20 = (delegate->super_VerifyCertificateChainDelegate).
                   _vptr_VerifyCertificateChainDelegate;
        uStack_130 = 0x32;
        pcVar28 = "Issuer is a trust leaf, considering as UNSPECIFIED";
        goto LAB_00381799;
      }
      goto LAB_0038179c;
    }
LAB_003817b7:
    CVar16 = CVar14;
    if (((this->cur_path_).cur_path_.
         super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->cur_path_).cur_path_.
         super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((this->next_issuer_).trust.require_leaf_selfsigned == true)) {
      pPVar29 = (this->next_issuer_).cert.
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      iVar15 = (*(delegate->super_VerifyCertificateChainDelegate).
                 _vptr_VerifyCertificateChainDelegate[2])(delegate);
      bVar38 = VerifyCertificateIsSelfSigned
                         (pPVar29,(SignatureVerifyCache *)CONCAT44(extraout_var,iVar15),
                          (CertErrors *)0x0);
      if (!bVar38) {
        iVar15 = (*(delegate->super_VerifyCertificateChainDelegate).
                   _vptr_VerifyCertificateChainDelegate[8])(delegate);
        if ((char)iVar15 != '\0') {
          pp_Var20 = (delegate->super_VerifyCertificateChainDelegate).
                     _vptr_VerifyCertificateChainDelegate;
          uStack_130 = 0x5f;
          pcVar28 = 
          "Leaf is trusted with require_leaf_selfsigned but is not self-signed, considering as UNSPECIFIED"
          ;
          goto LAB_00381799;
        }
        goto LAB_0038179c;
      }
      CVar16 = pCVar1->type;
    }
LAB_0038184b:
    if (CVar16 == UNSPECIFIED) goto LAB_00381869;
    if ((CVar16 - LAST < 3) || (CVar16 == DISTRUSTED)) goto LAB_00381cee;
  }
  else {
    if (CVar16 != LAST) {
      CVar14 = TRUSTED_ANCHOR_OR_LEAF;
      if (CVar16 - TRUSTED_ANCHOR_OR_LEAF < 2) goto LAB_003817b7;
      goto LAB_0038184b;
    }
    if ((this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00381cee:
      anon_unknown_6::CertIssuerIterPath::CopyPath(this_00,out_certs);
      ::std::
      vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>
      ::emplace_back<std::shared_ptr<bssl::ParsedCertificate_const>>
                ((vector<std::shared_ptr<bssl::ParsedCertificate_const>,std::allocator<std::shared_ptr<bssl::ParsedCertificate_const>>>
                  *)out_certs,(shared_ptr<const_bssl::ParsedCertificate> *)this);
      iVar15 = (*(delegate->super_VerifyCertificateChainDelegate).
                 _vptr_VerifyCertificateChainDelegate[8])(delegate);
      if ((char)iVar15 != '\0') {
        (anonymous_namespace)::PathDebugString_abi_cxx11_
                  (&local_b8,(_anonymous_namespace_ *)out_certs,certs);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &new_issuers,"CertPathIter returning path:\n",&local_b8);
        (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[9])
                  (delegate,new_issuers.
                            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                   new_issuers.
                   super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        ::std::__cxx11::string::~string((string *)&new_issuers);
        ::std::__cxx11::string::~string((string *)&local_b8);
      }
      *local_50 = (this->next_issuer_).trust;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      anon_unknown_6::IssuerEntry::operator=(&this->next_issuer_,(IssuerEntry *)&new_issuers);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &new_issuers.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      return true;
    }
    iVar15 = (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate
               [8])(delegate);
    if ((char)iVar15 != '\0') {
      pp_Var20 = (delegate->super_VerifyCertificateChainDelegate).
                 _vptr_VerifyCertificateChainDelegate;
      uStack_130 = 0x32;
      pcVar28 = "Leaf is a trust anchor, considering as UNSPECIFIED";
LAB_00381799:
      (*pp_Var20[9])(delegate,uStack_130,pcVar28);
    }
LAB_0038179c:
    pCVar1->type = UNSPECIFIED;
    pCVar1->enforce_anchor_expiry = false;
    pCVar1->enforce_anchor_constraints = false;
    pCVar1->require_anchor_basic_constraints = false;
    pCVar1->require_leaf_selfsigned = false;
LAB_00381869:
    peVar9 = (this->next_issuer_).cert.
             super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    new_issuers.
    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(peVar9->subject_alt_names_extension_).value.data_.size_;
    new_issuers.
    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(peVar9->tbs_).spki_tlv.data_.data_;
    new_issuers.
    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(peVar9->tbs_).spki_tlv.data_.size_;
    cVar21 = ::std::
             _Rb_tree<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Identity<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::find(&this_01->_M_t,(key_type *)&new_issuers);
    if (cVar21._M_node == local_38) {
      pCVar22 = (CertIssuersIter *)operator_new(0xb0);
      peVar9 = (this->next_issuer_).cert.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var10 = (this->next_issuer_).cert.
                super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->next_issuer_).cert.
      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->next_issuer_).cert.
      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pTVar11 = this->trust_store_;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pCVar22->cert_).super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar9;
      (pCVar22->cert_).super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var10;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pCVar22->cert_issuer_sources_ = local_48;
      pCVar22->trust_store_ = pTVar11;
      *(undefined8 *)
       &(pCVar22->issuers_).
        super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
        ._M_impl = 0;
      (pCVar22->issuers_).
      super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pCVar22->issuers_).
      super__Vector_base<bssl::(anonymous_namespace)::IssuerEntry,_std::allocator<bssl::(anonymous_namespace)::IssuerEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pCVar22->cur_issuer_ = 0;
      *(undefined8 *)((long)&pCVar22->cur_issuer_ + 1) = 0;
      *(undefined8 *)((long)&pCVar22->skipped_issuer_count_ + 1) = 0;
      (pCVar22->present_issuers_)._M_h._M_buckets =
           &(pCVar22->present_issuers_)._M_h._M_single_bucket;
      (pCVar22->present_issuers_)._M_h._M_bucket_count = 1;
      (pCVar22->present_issuers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pCVar22->present_issuers_)._M_h._M_element_count = 0;
      (pCVar22->present_issuers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      pCVar22->did_initial_query_ = false;
      pCVar22->did_async_issuer_query_ = false;
      (pCVar22->present_issuers_)._M_h._M_rehash_policy._M_next_resize = 0;
      (pCVar22->present_issuers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pCVar22->cur_async_request_ = 0;
      *(undefined8 *)
       &(pCVar22->pending_async_requests_).
        super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
        ._M_impl = 0;
      (pCVar22->pending_async_requests_).
      super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pCVar22->pending_async_requests_).
      super__Vector_base<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>,_std::allocator<std::unique_ptr<bssl::CertIssuerSource::Request,_std::default_delete<bssl::CertIssuerSource::Request>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c0._M_head_impl = pCVar22;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &new_issuers.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      lVar25 = *(long *)&(pCVar22->cert_).
                         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
      ;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar25 + 0x1b0);
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar25 + 0xa8);
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar25 + 0xb0);
      pVar39 = ::std::
               _Rb_tree<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::_Identity<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::less<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
               ::
               _M_insert_unique<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>
                         ((_Rb_tree<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::_Identity<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::less<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
                           *)this_01,
                          (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)&new_issuers);
      if (((undefined1  [16])pVar39 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        abort();
      }
      __last = (_Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                *)(this->cur_path_).cur_path_.
                  super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (__last == (_Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                     *)(this->cur_path_).cur_path_.
                       super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        this_02 = (_Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                   *)(this_00->cur_path_).
                     super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        if ((long)__last - (long)this_02 == 0x7ffffffffffffff8) {
          ::std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar36 = (long)__last - (long)this_02 >> 3;
        uVar17 = uVar36;
        if (__last == this_02) {
          uVar17 = 1;
        }
        uVar33 = uVar17 + uVar36;
        __alloc = (_Tp_alloc_type *)0xfffffffffffffff;
        if (0xffffffffffffffe < uVar33) {
          uVar33 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar17,uVar36)) {
          uVar33 = 0xfffffffffffffff;
        }
        if (uVar33 == 0) {
          __result = (pointer)0x0;
        }
        else {
          __result = (pointer)operator_new(uVar33 * 8);
        }
        __result[uVar36]._M_t.
        super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
        ._M_t.
        super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
        .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>._M_head_impl =
             pCVar22;
        local_c0._M_head_impl = (CertIssuersIter *)0x0;
        puVar23 = ::std::
                  vector<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                  ::_S_relocate((pointer)this_02,(pointer)__last,__result,__alloc);
        puVar23 = ::std::
                  vector<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                  ::_S_relocate((pointer)__last,(pointer)__last,puVar23 + 1,__alloc);
        ::std::
        _Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ::_M_deallocate(this_02,(pointer)((long)(this->cur_path_).cur_path_.
                                                super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)this_02 >> 3),__n);
        (this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = __result;
        (this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar23;
        (this->cur_path_).cur_path_.
        super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar33;
      }
      else {
        (((tuple<bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
           *)&(__last->_M_impl).super__Vector_impl_data._M_start)->
        super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
        ).super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>._M_head_impl
             = pCVar22;
        local_c0._M_head_impl = (CertIssuersIter *)0x0;
        ppuVar3 = &(this->cur_path_).cur_path_.
                   super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppuVar3 = *ppuVar3 + 1;
      }
      delegate = local_98;
      ::std::
      unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
      ::~unique_ptr((unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                     *)&local_c0);
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      anon_unknown_6::IssuerEntry::operator=(&this->next_issuer_,(IssuerEntry *)&new_issuers);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &new_issuers.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      iVar15 = (*(delegate->super_VerifyCertificateChainDelegate).
                 _vptr_VerifyCertificateChainDelegate[8])(delegate);
      if ((char)iVar15 != '\0') {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        puVar12 = (this->cur_path_).cur_path_.
                  super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pPVar29 = extraout_RDX;
        for (puVar32 = (this->cur_path_).cur_path_.
                       super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar12;
            puVar32 = puVar32 + 1) {
          if (local_90._M_string_length != 0) {
            ::std::__cxx11::string::append((char *)&local_90);
            pPVar29 = extraout_RDX_00;
          }
          (anonymous_namespace)::CertDebugString_abi_cxx11_
                    (&local_b8,
                     *(_anonymous_namespace_ **)
                      &(((puVar32->_M_t).
                         super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                         .
                         super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>
                        ._M_head_impl)->cert_).
                       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                     ,pPVar29);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &new_issuers," ",&local_b8);
          ::std::__cxx11::string::append((string *)&local_90);
          ::std::__cxx11::string::~string((string *)&new_issuers);
          ::std::__cxx11::string::~string((string *)&local_b8);
          pPVar29 = extraout_RDX_01;
        }
        ::std::operator+(&local_70,"CertPathIter cur_path_ =\n",&local_90);
        (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[9])
                  (delegate,local_70._M_string_length,local_70._M_dataplus._M_p);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_90);
      }
    }
    else {
      psVar2 = &((this->cur_path_).cur_path_.
                 super__Vector_base<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>,_std::allocator<std::unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                 .super__Head_base<0UL,_bssl::(anonymous_namespace)::CertIssuersIter_*,_false>.
                _M_head_impl)->skipped_issuer_count_;
      *psVar2 = *psVar2 + 1;
      iVar15 = (*(delegate->super_VerifyCertificateChainDelegate).
                 _vptr_VerifyCertificateChainDelegate[8])(delegate);
      if ((char)iVar15 != '\0') {
        (anonymous_namespace)::CertDebugString_abi_cxx11_
                  (&local_b8,
                   (_anonymous_namespace_ *)
                   (this->next_issuer_).cert.
                   super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,cert);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &new_issuers,"CertPathIter skipping dupe cert: ",&local_b8);
        (*(delegate->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[9])
                  (delegate,new_issuers.
                            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                   new_issuers.
                   super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        ::std::__cxx11::string::~string((string *)&new_issuers);
        ::std::__cxx11::string::~string((string *)&local_b8);
      }
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      new_issuers.
      super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
      anon_unknown_6::IssuerEntry::operator=(&this->next_issuer_,(IssuerEntry *)&new_issuers);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &new_issuers.
                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  goto LAB_003812d8;
code_r0x003813fe:
  bVar38 = psVar19 == (pointer)0x1;
  psVar19 = (pointer)((ulong)((long)&(psVar19->
                                     super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + 1U) >> 1);
  if (bVar38) {
    psVar19 = (pointer)0x0;
  }
  goto LAB_003813d6;
}

Assistant:

bool CertPathIter::GetNextPath(ParsedCertificateList *out_certs,
                               CertificateTrust *out_last_cert_trust,
                               CertPathErrors *out_errors,
                               CertPathBuilderDelegate *delegate,
                               uint32_t *iteration_count,
                               const uint32_t max_iteration_count,
                               const uint32_t max_path_building_depth) {
  out_certs->clear();
  *out_last_cert_trust = CertificateTrust::ForUnspecified();

  while (true) {
    if (delegate->IsDeadlineExpired()) {
      if (cur_path_.Empty()) {
        // If the deadline is already expired before the first call to
        // GetNextPath, cur_path_ will be empty. Return the leaf cert in that
        // case.
        if (next_issuer_.cert) {
          out_certs->push_back(next_issuer_.cert);
        }
      } else {
        cur_path_.CopyPath(out_certs);
      }
      out_errors->GetOtherErrors()->AddError(cert_errors::kDeadlineExceeded);
      return false;
    }

    // We are not done yet, so if the current path is at the depth limit then
    // we must backtrack to find an acceptable solution.
    if (max_path_building_depth > 0 &&
        cur_path_.Length() >= max_path_building_depth) {
      cur_path_.CopyPath(out_certs);
      out_errors->GetOtherErrors()->AddError(cert_errors::kDepthLimitExceeded);
      if (delegate->IsDebugLogEnabled()) {
        delegate->DebugLog(
            "CertPathIter reached depth limit. Returning "
            "partial path and backtracking:\n" +
            PathDebugString(*out_certs));
      }
      cur_path_.Pop();
      return true;
    }

    if (!next_issuer_.cert) {
      if (cur_path_.Empty()) {
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter exhausted all paths...");
        }
        return false;
      }

      (*iteration_count)++;
      if (max_iteration_count > 0 && *iteration_count > max_iteration_count) {
        cur_path_.CopyPath(out_certs);
        out_errors->GetOtherErrors()->AddError(
            cert_errors::kIterationLimitExceeded);
        return false;
      }

      cur_path_.back()->GetNextIssuer(&next_issuer_);
      if (!next_issuer_.cert) {
        if (!cur_path_.back()->had_non_skipped_issuers()) {
          // If the end of a path was reached without finding an anchor, return
          // the partial path before backtracking.
          cur_path_.CopyPath(out_certs);
          out_errors->GetErrorsForCert(out_certs->size() - 1)
              ->AddError(cert_errors::kNoIssuersFound);
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "CertPathIter returning partial path and backtracking:\n" +
                PathDebugString(*out_certs));
          }
          cur_path_.Pop();
          return true;
        } else {
          // No more issuers for current chain, go back up and see if there are
          // any more for the previous cert.
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog("CertPathIter backtracking...");
          }
          cur_path_.Pop();
          continue;
        }
      }
    }

    // Overrides for cert with trust appearing in the wrong place for the type
    // of trust (trusted leaf in non-leaf position, or trust anchor in leaf
    // position.)
    switch (next_issuer_.trust.type) {
      case CertificateTrustType::TRUSTED_ANCHOR:
        // If the leaf cert is trusted only as an anchor, treat it as having
        // unspecified trust. This may allow a successful path to be built to a
        // different root (or to the same cert if it's self-signed).
        if (cur_path_.Empty()) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Leaf is a trust anchor, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::TRUSTED_LEAF:
        // If a non-leaf cert is trusted only as a leaf, treat it as having
        // unspecified trust. This may allow a successful path to be built to a
        // trusted root.
        if (!cur_path_.Empty()) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Issuer is a trust leaf, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::UNSPECIFIED:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
        // No override necessary.
        break;
    }

    // Overrides for trusted leaf cert with require_leaf_selfsigned. If the leaf
    // isn't actually self-signed, treat it as unspecified.
    switch (next_issuer_.trust.type) {
      case CertificateTrustType::TRUSTED_LEAF:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
        if (cur_path_.Empty() && next_issuer_.trust.require_leaf_selfsigned &&
            !VerifyCertificateIsSelfSigned(*next_issuer_.cert,
                                           delegate->GetVerifyCache(),
                                           /*errors=*/nullptr)) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Leaf is trusted with require_leaf_selfsigned but is "
                "not self-signed, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::TRUSTED_ANCHOR:
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::UNSPECIFIED:
        // No override necessary.
        break;
    }

    switch (next_issuer_.trust.type) {
      // If the trust for this issuer is "known" (either because it is
      // distrusted, or because it is trusted) then stop building and return the
      // path.
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::TRUSTED_ANCHOR:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
      case CertificateTrustType::TRUSTED_LEAF: {
        // If the issuer has a known trust level, can stop building the path.
        cur_path_.CopyPath(out_certs);
        out_certs->push_back(std::move(next_issuer_.cert));
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter returning path:\n" +
                             PathDebugString(*out_certs));
        }
        *out_last_cert_trust = next_issuer_.trust;
        next_issuer_ = IssuerEntry();
        return true;
      }
      case CertificateTrustType::UNSPECIFIED: {
        // Skip this cert if it is already in the chain.
        if (cur_path_.IsPresent(next_issuer_.cert.get())) {
          cur_path_.back()->increment_skipped_issuer_count();
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog("CertPathIter skipping dupe cert: " +
                               CertDebugString(next_issuer_.cert.get()));
          }
          next_issuer_ = IssuerEntry();
          continue;
        }

        cur_path_.Append(std::make_unique<CertIssuersIter>(
            std::move(next_issuer_.cert), &cert_issuer_sources_, trust_store_));
        next_issuer_ = IssuerEntry();
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter cur_path_ =\n" +
                             cur_path_.PathDebugString());
        }
        // Continue descending the tree.
        continue;
      }
    }
  }
}